

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

string * __thiscall
PacketBuilder::Get_abi_cxx11_(string *__return_storage_ptr__,PacketBuilder *this)

{
  char cVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  PacketProcessor::ENumber((int)(this->data)._M_string_length + (int)this->add_size + 2);
  cVar1 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar1);
  std::__cxx11::string::push_back(cVar1);
  std::__cxx11::string::push_back(cVar1);
  std::__cxx11::string::push_back(cVar1);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string PacketBuilder::Get() const
{
	std::string retdata;
	retdata.reserve(4 + this->data.length());
	std::array<unsigned char, 2> id = PacketProcessor::EPID(this->id);
	std::array<unsigned char, 4> length = PacketProcessor::ENumber(this->data.length() + 2 + this->add_size);

	retdata += length[0];
	retdata += length[1];
	retdata += id[0];
	retdata += id[1];
	retdata += this->data;

	return retdata;
}